

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

int64 __thiscall
TTD::EventLog::FindSnapTimeForEventTime(EventLog *this,int64 targetTime,int64 *optEndSnapTime)

{
  Type piVar1;
  int64 iVar2;
  undefined1 local_60 [8];
  Iterator iter;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isSnap;
  bool isRoot;
  bool hasRtrSnap;
  
  if (optEndSnapTime != (int64 *)0x0) {
    *optEndSnapTime = -1;
  }
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_60,&this->m_eventList);
  iVar2 = -1;
  if (local_60 != (undefined1  [8])0x0) {
    iter.m_previousEventMap =
         (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)optEndSnapTime;
    do {
      if ((iter.m_currLink < *(TTEventListLink **)((long)local_60 + 8)) ||
         ((TTEventListLink *)*(size_t *)local_60 <= iter.m_currLink)) break;
      local_33 = false;
      local_32 = false;
      local_31[0] = false;
      iVar2 = NSLogEvents::AccessTimeInRootCallOrSnapshot
                        ((EventLogEntry *)
                         (*(byte **)((long)local_60 + 0x10) + (long)&(iter.m_currLink)->CurrPos),
                         &local_33,&local_32,local_31);
      if ((iVar2 <= targetTime) &&
         (optEndSnapTime = (int64 *)iter.m_previousEventMap,
         (local_31[0] & local_32) != 0 || local_33 != false)) goto LAB_008d3908;
      TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_60);
    } while (local_60 != (undefined1  [8])0x0);
    iVar2 = -1;
    optEndSnapTime = (int64 *)iter.m_previousEventMap;
  }
LAB_008d3908:
  if ((BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)optEndSnapTime !=
      (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    TTEventList::GetIteratorAtFirst((Iterator *)local_60,&this->m_eventList);
    while( true ) {
      if (local_60 == (undefined1  [8])0x0) {
        return iVar2;
      }
      if (iter.m_currLink < *(TTEventListLink **)((long)local_60 + 8)) {
        return iVar2;
      }
      if ((TTEventListLink *)*(size_t *)local_60 <= iter.m_currLink) {
        return iVar2;
      }
      if ((*(int *)(*(byte **)((long)local_60 + 0x10) + (long)iter.m_currLink) == 1) &&
         (piVar1 = *(Type *)(*(byte **)((long)local_60 + 0x10) + 0x10 + (long)iter.m_currLink),
         iVar2 < (long)piVar1)) break;
      TTEventList::Iterator::MoveNext((Iterator *)local_60);
    }
    ((BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      *)optEndSnapTime)->buckets = piVar1;
  }
  return iVar2;
}

Assistant:

int64 EventLog::FindSnapTimeForEventTime(int64 targetTime, int64* optEndSnapTime)
    {
        int64 snapTime = -1;
        if(optEndSnapTime != nullptr)
        {
            *optEndSnapTime = -1;
        }

        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            bool isSnap = false;
            bool isRoot = false;
            bool hasRtrSnap = false;
            int64 time = NSLogEvents::AccessTimeInRootCallOrSnapshot(iter.Current(), isSnap, isRoot, hasRtrSnap);

            bool validSnap =  isSnap | (isRoot & hasRtrSnap);
            if(validSnap && time <= targetTime)
            {
                snapTime = time;
                break;
            }
        }

        if(optEndSnapTime != nullptr)
        {
            for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
            {
                if(iter.Current()->EventKind == NSLogEvents::EventKind::SnapshotTag)
                {
                    NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                    if(snapEvent->RestoreTimestamp > snapTime)
                    {
                        *optEndSnapTime = snapEvent->RestoreTimestamp;
                        break;
                    }
                }
            }
        }

        return snapTime;
    }